

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-opt.cpp
# Opt level: O3

void helper_after_test_gradient_accumulation
               (char *func,int nbatch_physical,ggml_opt_loss_type loss_type,int epoch,
               string *subtest,bool subtest_ok,int *ntest,int *npass)

{
  string options_00;
  string subtest_00;
  uint uVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  ulong uVar3;
  ggml_opt_loss_type __val;
  uint uVar4;
  undefined4 uVar5;
  undefined7 in_register_00000089;
  uint uVar6;
  uint uVar7;
  string options;
  undefined8 in_stack_ffffffffffffff30;
  undefined1 *puVar8;
  undefined8 in_stack_ffffffffffffff40;
  long in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff50 [12];
  long *plVar9;
  long local_98;
  long local_90 [2];
  undefined8 local_80;
  long *local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_80 = CONCAT71(in_register_00000089,subtest_ok);
  local_78 = (long *)CONCAT44(in_register_0000000c,epoch);
  uVar5 = SUB84(subtest,0);
  plVar9 = local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff60,", nbatch_physical=","");
  uVar7 = (uint)func;
  uVar6 = -uVar7;
  if (0 < (int)uVar7) {
    uVar6 = uVar7;
  }
  uVar4 = 1;
  if (9 < uVar6) {
    uVar3 = (ulong)uVar6;
    uVar1 = 4;
    do {
      uVar4 = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        uVar4 = uVar4 - 2;
        goto LAB_00107734;
      }
      if (uVar2 < 1000) {
        uVar4 = uVar4 - 1;
        goto LAB_00107734;
      }
      if (uVar2 < 10000) goto LAB_00107734;
      uVar3 = uVar3 / 10000;
      uVar1 = uVar4 + 4;
    } while (99999 < uVar2);
    uVar4 = uVar4 + 1;
  }
LAB_00107734:
  puVar8 = &stack0xffffffffffffff48;
  std::__cxx11::string::_M_construct
            ((ulong)&stack0xffffffffffffff38,(char)uVar4 - ((char)((ulong)func >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>(puVar8 + (uVar7 >> 0x1f),uVar4,uVar6);
  std::__cxx11::string::_M_append(&stack0xffffffffffffff60,(ulong)puVar8);
  if (puVar8 != &stack0xffffffffffffff48) {
    operator_delete(puVar8,in_stack_ffffffffffffff48 + 1);
  }
  std::__cxx11::string::append(&stack0xffffffffffffff60);
  std::__cxx11::string::append(&stack0xffffffffffffff60);
  std::__cxx11::string::append(&stack0xffffffffffffff60);
  __val = -loss_type;
  if (0 < (int)loss_type) {
    __val = loss_type;
  }
  uVar6 = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar7 = 4;
    do {
      uVar6 = uVar7;
      uVar4 = (uint)uVar3;
      if (uVar4 < 100) {
        uVar6 = uVar6 - 2;
        goto LAB_0010782f;
      }
      if (uVar4 < 1000) {
        uVar6 = uVar6 - 1;
        goto LAB_0010782f;
      }
      if (uVar4 < 10000) goto LAB_0010782f;
      uVar3 = uVar3 / 10000;
      uVar7 = uVar6 + 4;
    } while (99999 < uVar4);
    uVar6 = uVar6 + 1;
  }
LAB_0010782f:
  puVar8 = &stack0xffffffffffffff48;
  std::__cxx11::string::_M_construct
            ((ulong)&stack0xffffffffffffff38,(char)uVar6 - (char)((int)loss_type >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(puVar8 + (loss_type >> 0x1f),uVar6,__val);
  std::__cxx11::string::_M_append(&stack0xffffffffffffff60,(ulong)puVar8);
  if (puVar8 != &stack0xffffffffffffff48) {
    operator_delete(puVar8,in_stack_ffffffffffffff48 + 1);
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,plVar9,local_98 + (long)plVar9);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,*local_78,local_78[1] + *local_78);
  options_00._M_string_length = in_stack_ffffffffffffff30;
  options_00._M_dataplus._M_p = (pointer)ntest;
  options_00.field_2._M_allocated_capacity = (size_type)puVar8;
  options_00.field_2._8_8_ = in_stack_ffffffffffffff40;
  subtest_00._8_12_ = in_stack_ffffffffffffff50;
  subtest_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff48;
  subtest_00.field_2._M_allocated_capacity._4_4_ = uVar5;
  subtest_00.field_2._8_8_ = plVar9;
  helper_after_test("test_gradient_accumulation",false,options_00,subtest_00,SUB81(local_70[0],0),
                    (int *)local_50[0],(int *)(ulong)(byte)uVar5);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (plVar9 != local_90) {
    operator_delete(plVar9,local_90[0] + 1);
  }
  return;
}

Assistant:

static void helper_after_test_gradient_accumulation(
        const char * func, const int nbatch_physical, const enum ggml_opt_loss_type loss_type, const int epoch,
        const std::string subtest, const bool subtest_ok, int & ntest, int & npass) {
    std::string options = ", nbatch_physical=";
    options += std::to_string(nbatch_physical);
    options += ", loss_type=";
    options += loss_type == GGML_OPT_LOSS_TYPE_MEAN ? "mean" : "sum";
    options += ", epoch=";
    options += std::to_string(epoch);
    helper_after_test(func, false, options, subtest, subtest_ok, ntest, npass);
}